

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

Vec_Int_t * Vec_IntStartNatural(int nSize)

{
  Vec_Int_t *pVVar1;
  ulong uVar2;
  ulong uVar3;
  
  pVVar1 = Vec_IntAlloc(nSize);
  pVVar1->nSize = nSize;
  uVar2 = 0;
  uVar3 = (ulong)(uint)nSize;
  if (nSize < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pVVar1->pArray[uVar2] = (int)uVar2;
  }
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntStartNatural( int nSize )
{
    Vec_Int_t * p;
    int i;
    p = Vec_IntAlloc( nSize );
    p->nSize = nSize;
    for ( i = 0; i < nSize; i++ )
        p->pArray[i] = i;
    return p;
}